

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O3

void WebRtc_FreeDelayEstimatorFarend(void *handle)

{
  DelayEstimatorFarend *self;
  
  if (handle != (void *)0x0) {
    free(*handle);
    *(undefined8 *)handle = 0;
    WebRtc_FreeBinaryDelayEstimatorFarend(*(BinaryDelayEstimatorFarend **)((long)handle + 0x10));
    free(handle);
    return;
  }
  return;
}

Assistant:

void WebRtc_FreeDelayEstimatorFarend(void* handle) {
  DelayEstimatorFarend* self = (DelayEstimatorFarend*) handle;

  if (handle == NULL) {
    return;
  }

  free(self->mean_far_spectrum);
  self->mean_far_spectrum = NULL;

  WebRtc_FreeBinaryDelayEstimatorFarend(self->binary_farend);
  self->binary_farend = NULL;

  free(self);
}